

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

void __thiscall SVGChart::PPlot::~PPlot(PPlot *this)

{
  PPlot *this_local;
  
  (this->super_PDrawer)._vptr_PDrawer = (_func_int **)&PTR__PPlot_001245f0;
  if (((this->mOwnsPPlotDrawer & 1U) != 0) && (this->mPPlotDrawer != (PDrawer *)0x0)) {
    (*this->mPPlotDrawer->_vptr_PDrawer[1])();
  }
  NamedTickIterator::~NamedTickIterator(&this->mXNamedTickIterator);
  LogTickIterator::~LogTickIterator(&this->mYLogTickIterator);
  LogTickIterator::~LogTickIterator(&this->mXLogTickIterator);
  LinTickIterator::~LinTickIterator(&this->mYLinTickIterator);
  LinTickIterator::~LinTickIterator(&this->mXLinTickIterator);
  LogTrafo::~LogTrafo(&this->mYLogTrafo);
  LogTrafo::~LogTrafo(&this->mXLogTrafo);
  LinTrafo::~LinTrafo(&this->mYLinTrafo);
  LinTrafo::~LinTrafo(&this->mXLinTrafo);
  std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::~vector
            (&this->mPostDrawerList);
  std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::~vector
            (&this->mPreDrawerList);
  std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>::~vector
            (&this->mPostCalculatorList);
  std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>::~vector
            (&this->mModifyingCalculatorList);
  PlotBackground::~PlotBackground(&this->mPlotBackground);
  AxisSetup::~AxisSetup(&this->mYAxisSetup);
  AxisSetup::~AxisSetup(&this->mXAxisSetup);
  PlotDataContainer::~PlotDataContainer(&this->mPlotDataContainer);
  PDrawer::~PDrawer(&this->super_PDrawer);
  return;
}

Assistant:

PPlot::~PPlot () {
      if (mOwnsPPlotDrawer) {
        delete mPPlotDrawer;
      }
    }